

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetDyndepFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  long *plVar3;
  cmGlobalNinjaGenerator *pcVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  long *local_110;
  undefined8 local_108;
  long local_100 [2];
  long *local_f0;
  size_t local_e8;
  long local_e0 [2];
  string local_d0;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined8 local_70;
  long *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  pcVar1 = this->LocalGenerator;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pcVar1->HomeRelativeOutputPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pcVar1->HomeRelativeOutputPath)._M_string_length);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xe])
            (&local_f0,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  plVar3 = local_f0;
  pcVar4 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  (*(pcVar4->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
            (&local_110,pcVar4,config);
  local_80._M_len = local_e8;
  local_80._M_str = (char *)plVar3;
  local_70 = local_108;
  local_68 = local_110;
  local_a8 = local_a0;
  local_b0 = 1;
  local_a0[0] = 0x2f;
  local_60 = 1;
  local_48 = (lang->_M_dataplus)._M_p;
  local_50 = lang->_M_string_length;
  local_40 = 3;
  local_38 = ".dd";
  views._M_len = 5;
  views._M_array = &local_80;
  local_58 = local_a8;
  cmCatViews_abi_cxx11_(&local_d0,views);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetDyndepFilePath(
  std::string const& lang, const std::string& config) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path += cmStrCat(
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
    this->GetGlobalGenerator()->ConfigDirectory(config), '/', lang, ".dd");
  return path;
}